

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O3

void Nwk_ManUpdateLevel(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *vQueue;
  Nwk_Obj_t *pObj_00;
  Vec_Ptr_t *pVVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void **__ptr;
  ulong uVar5;
  long lVar6;
  Nwk_Obj_t *pObj_01;
  ulong uVar7;
  long lVar8;
  
  if ((*(uint *)&pObj->field_0x20 & 7) != 3) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                  ,0x305,"void Nwk_ManUpdateLevel(Nwk_Obj_t *)");
  }
  p = pObj->pMan->pManTime;
  vQueue = pObj->pMan->vTemp;
  vQueue->nSize = 0;
  iVar2 = 0;
  __ptr = vQueue->pArray;
  if (vQueue->nCap == 0) {
    if (__ptr == (void **)0x0) {
      __ptr = (void **)malloc(0x80);
      iVar2 = 0;
    }
    else {
      __ptr = (void **)realloc(__ptr,0x80);
      iVar2 = vQueue->nSize;
    }
    vQueue->pArray = __ptr;
    vQueue->nCap = 0x10;
  }
  vQueue->nSize = iVar2 + 1;
  __ptr[iVar2] = pObj;
  pObj->field_0x20 = pObj->field_0x20 | 0x10;
  if (0 < vQueue->nSize) {
    lVar8 = 0;
    pObj_01 = (Nwk_Obj_t *)0x0;
    do {
      pObj_00 = (Nwk_Obj_t *)vQueue->pArray[lVar8];
      *(uint *)&pObj_00->field_0x20 = *(uint *)&pObj_00->field_0x20 & 0xffffffef;
      iVar2 = Nwk_ObjLevelNew(pObj_00);
      if (iVar2 != pObj_00->Level) {
        pObj_00->Level = iVar2;
        if ((*(uint *)&pObj_00->field_0x20 & 7) == 2) {
          if ((p != (Tim_Man_t *)0x0) &&
             (iVar2 = Tim_ManBoxForCo(p,*(uint *)&pObj_00->field_0x20 >> 7), -1 < iVar2)) {
            Tim_ManSetCurrentTravIdBoxInputs(p,iVar2);
            uVar3 = Tim_ManBoxOutputFirst(p,iVar2);
            uVar4 = Tim_ManBoxOutputNum(p,iVar2);
            if (0 < (int)uVar4) {
              uVar7 = (ulong)uVar3;
              uVar5 = (ulong)uVar4;
              do {
                if (((int)uVar3 < 0) || (pVVar1 = pObj_01->pMan->vCis, pVVar1->nSize <= (int)uVar7))
                {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                pObj_01 = (Nwk_Obj_t *)pVVar1->pArray[uVar7];
                if ((pObj_01->field_0x20 & 0x10) == 0) {
                  Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,(int)lVar8,1);
                  pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
                }
                uVar7 = uVar7 + 1;
                uVar5 = uVar5 - 1;
              } while (uVar5 != 0);
            }
          }
        }
        else {
          iVar2 = pObj_00->nFanouts;
          if (0 < iVar2) {
            lVar6 = 0;
            do {
              pObj_01 = pObj_00->pFanio[pObj_00->nFanins + lVar6];
              if (pObj_01 == (Nwk_Obj_t *)0x0) {
                pObj_01 = (Nwk_Obj_t *)0x0;
                break;
              }
              if ((pObj_01->field_0x20 & 0x10) == 0) {
                Nwk_NodeUpdateAddToQueue(vQueue,pObj_01,(int)lVar8,1);
                pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
                iVar2 = pObj_00->nFanouts;
              }
              lVar6 = lVar6 + 1;
            } while ((int)lVar6 < iVar2);
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vQueue->nSize);
  }
  return;
}

Assistant:

void Nwk_ManUpdateLevel( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Vec_Ptr_t * vQueue = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    Nwk_Obj_t * pNext = NULL; // Suppress "might be used uninitialized"
    int LevelNew, iCur, k, iBox, iTerm1, nTerms;
    assert( Nwk_ObjIsNode(pObj) );
    // initialize the queue with the node
    Vec_PtrClear( vQueue );
    Vec_PtrPush( vQueue, pObj );
    pObj->MarkA = 1;
    // process objects
    Vec_PtrForEachEntry( Nwk_Obj_t *, vQueue, pTemp, iCur )
    {
        pTemp->MarkA = 0;
        LevelNew = Nwk_ObjLevelNew( pTemp );
        if ( LevelNew == Nwk_ObjLevel(pTemp) )
            continue;
        Nwk_ObjSetLevel( pTemp, LevelNew );
        // add the fanouts to the queue
        if ( Nwk_ObjIsCo(pTemp) )
        {
            if ( pManTime )
            {
                iBox = Tim_ManBoxForCo( pManTime, pTemp->PioId );
                if ( iBox >= 0 ) // this is not a true PO
                {
                    Tim_ManSetCurrentTravIdBoxInputs( pManTime, iBox );
                    iTerm1 = Tim_ManBoxOutputFirst( pManTime, iBox );
                    nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCi(pNext->pMan, iTerm1 + k);
                        if ( pNext->MarkA )
                            continue;
                        Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                        pNext->MarkA = 1;
                    }
                }
            }
        }
        else
        {
            Nwk_ObjForEachFanout( pTemp, pNext, k )
            {
                if ( pNext->MarkA )
                    continue;
                Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                pNext->MarkA = 1;
            }
        }
    }
}